

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O2

CURLcode Curl_rtsp_parseheader(Curl_easy *data,char *header)

{
  uchar *puVar1;
  char cVar2;
  RTSP *pRVar3;
  curl_trc_feat *pcVar4;
  curl_off_t cVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  size_t length;
  curl_off_t CSeq;
  char *p;
  char *local_40;
  char *local_38;
  
  iVar6 = curl_strnequal(header,"CSeq:",5);
  if (iVar6 == 0) {
    iVar6 = curl_strnequal(header,"Session:",8);
    if (iVar6 == 0) {
      iVar6 = curl_strnequal(header,"Transport:",10);
      if (iVar6 == 0) {
        return CURLE_OK;
      }
      pcVar9 = header + 10;
      CSeq = (curl_off_t)pcVar9;
      while( true ) {
        if ((char *)CSeq == (char *)0x0) {
          return CURLE_OK;
        }
        if (*(char *)CSeq == '\0') {
          return CURLE_OK;
        }
        Curl_str_passblanks((char **)&CSeq);
        cVar5 = CSeq;
        pcVar8 = strchr((char *)CSeq,0x3b);
        iVar6 = curl_strnequal((char *)cVar5,"interleaved=",0xc);
        if (iVar6 != 0) break;
        CSeq = (curl_off_t)(pcVar8 + 1);
        if (pcVar8 == (char *)0x0) {
          CSeq = 0;
        }
      }
      local_40 = (char *)(CSeq + 0xc);
      iVar6 = Curl_str_number(&local_40,(curl_off_t *)&p,0xff);
      pcVar8 = p;
      if (iVar6 == 0) {
        local_38 = p;
        iVar6 = Curl_str_single(&local_40,'-');
        if (((((iVar6 == 0) &&
              (iVar6 = Curl_str_number(&local_40,(curl_off_t *)&local_38,0xff), pcVar8 = local_38,
              iVar6 != 0)) && (pcVar8 = p, data != (Curl_easy *)0x0)) &&
            (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",
                     pcVar9);
          pcVar8 = p;
        }
        for (; (long)p <= (long)pcVar8; p = p + 1) {
          puVar1 = (data->state).rtp_channel_mask +
                   (int)((long)((ulong)(uint)((int)p >> 0x1f) << 0x20 | (ulong)p & 0xffffffff) / 8);
          *puVar1 = *puVar1 | (byte)(1 << ((byte)p & 7));
        }
        return CURLE_OK;
      }
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (((data->set).field_0x89f & 0x40) == 0) {
        return CURLE_OK;
      }
      pcVar4 = (data->state).feat;
      if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
        return CURLE_OK;
      }
      Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",pcVar9)
      ;
      return CURLE_OK;
    }
    CSeq = (curl_off_t)(header + 8);
    Curl_str_passblanks((char **)&CSeq);
    cVar5 = CSeq;
    if (*(char *)CSeq == '\0') {
      Curl_failf(data,"Got a blank Session ID");
      return CURLE_RTSP_SESSION_ERROR;
    }
    length = 0xffffffffffffffff;
    do {
      cVar2 = *(char *)(CSeq + 1 + length);
      length = length + 1;
      if (cVar2 < '!') break;
    } while (cVar2 != ';');
    pcVar9 = (data->set).str[0x33];
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (char *)Curl_memdup0((char *)CSeq,length);
      (data->set).str[0x33] = pcVar9;
      if (pcVar9 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      sVar7 = strlen(pcVar9);
      if ((sVar7 != length) || (iVar6 = strncmp((char *)cVar5,pcVar9,length), iVar6 != 0)) {
        Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",cVar5,pcVar9);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
  }
  else {
    CSeq = 0;
    pRVar3 = (data->req).p.rtsp;
    p = header + 5;
    Curl_str_passblanks(&p);
    iVar6 = Curl_str_number(&p,&CSeq,0x7fffffffffffffff);
    if (iVar6 != 0) {
      Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    pRVar3->CSeq_recv = CSeq;
    (data->state).rtsp_CSeq_recv = CSeq;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct Curl_easy *data, const char *header)
{
  if(checkprefix("CSeq:", header)) {
    curl_off_t CSeq = 0;
    struct RTSP *rtsp = data->req.p.rtsp;
    const char *p = &header[5];
    Curl_str_passblanks(&p);
    if(Curl_str_number(&p, &CSeq, LONG_MAX)) {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    rtsp->CSeq_recv = (long)CSeq; /* mark the request */
    data->state.rtsp_CSeq_recv = (long)CSeq; /* update the handle */
  }
  else if(checkprefix("Session:", header)) {
    const char *start, *end;
    size_t idlen;

    /* Find the first non-space letter */
    start = header + 8;
    Curl_str_passblanks(&start);

    if(!*start) {
      failf(data, "Got a blank Session ID");
      return CURLE_RTSP_SESSION_ERROR;
    }

    /* Find the end of Session ID
     *
     * Allow any non whitespace content, up to the field separator or end of
     * line. RFC 2326 is not 100% clear on the session ID and for example
     * gstreamer does url-encoded session ID's not covered by the standard.
     */
    end = start;
    while((*end > ' ') && (*end != ';'))
      end++;
    idlen = end - start;

    if(data->set.str[STRING_RTSP_SESSION_ID]) {

      /* If the Session ID is set, then compare */
      if(strlen(data->set.str[STRING_RTSP_SESSION_ID]) != idlen ||
         strncmp(start, data->set.str[STRING_RTSP_SESSION_ID], idlen)) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       */

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = Curl_memdup0(start, idlen);
      if(!data->set.str[STRING_RTSP_SESSION_ID])
        return CURLE_OUT_OF_MEMORY;
    }
  }
  else if(checkprefix("Transport:", header)) {
    CURLcode result;
    result = rtsp_parse_transport(data, header + 10);
    if(result)
      return result;
  }
  return CURLE_OK;
}